

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::EbmlElementSize(uint64 type,uint64 value,uint64 fixed_size)

{
  int32 iVar1;
  int32 iVar2;
  long in_RDX;
  uint64 in_RSI;
  uint64 in_RDI;
  uint64 ebml_size;
  undefined8 local_28;
  
  iVar1 = GetUIntSize(in_RDI);
  local_28 = in_RDX;
  if (in_RDX == 0) {
    iVar2 = GetUIntSize(in_RSI);
    local_28 = (long)iVar2;
  }
  return local_28 + iVar1 + 1;
}

Assistant:

uint64 EbmlElementSize(uint64 type, uint64 value, uint64 fixed_size) {
  // Size of EBML ID
  uint64 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += (fixed_size > 0) ? fixed_size : GetUIntSize(value);

  // Size of Datasize
  ebml_size++;

  return ebml_size;
}